

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucbuf.cpp
# Opt level: O1

UBool ucbuf_isCPKnown(char *cp)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = ucnv_compareNames_63("UTF-8",cp);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = ucnv_compareNames_63("UTF-16BE",cp);
    if (iVar1 != 0) {
      iVar1 = ucnv_compareNames_63("UTF-16LE",cp);
      if (iVar1 != 0) {
        iVar1 = ucnv_compareNames_63("UTF-16",cp);
        if (iVar1 != 0) {
          iVar1 = ucnv_compareNames_63("UTF-32",cp);
          if (iVar1 != 0) {
            iVar1 = ucnv_compareNames_63("UTF-32BE",cp);
            if (iVar1 != 0) {
              iVar1 = ucnv_compareNames_63("UTF-32LE",cp);
              if (iVar1 != 0) {
                iVar1 = ucnv_compareNames_63("SCSU",cp);
                if (iVar1 != 0) {
                  iVar1 = ucnv_compareNames_63("BOCU-1",cp);
                  if (iVar1 != 0) {
                    iVar1 = ucnv_compareNames_63("UTF-7",cp);
                    bVar2 = iVar1 == 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

static UBool ucbuf_isCPKnown(const char* cp){
    if(ucnv_compareNames("UTF-8",cp)==0){
        return TRUE;
    }
    if(ucnv_compareNames("UTF-16BE",cp)==0){
        return TRUE;
    }
    if(ucnv_compareNames("UTF-16LE",cp)==0){
        return TRUE;
    }
    if(ucnv_compareNames("UTF-16",cp)==0){
        return TRUE;
    }
    if(ucnv_compareNames("UTF-32",cp)==0){
        return TRUE;
    }
    if(ucnv_compareNames("UTF-32BE",cp)==0){
        return TRUE;
    }
    if(ucnv_compareNames("UTF-32LE",cp)==0){
        return TRUE;
    }
    if(ucnv_compareNames("SCSU",cp)==0){
        return TRUE;
    }
    if(ucnv_compareNames("BOCU-1",cp)==0){
        return TRUE;
    }
    if(ucnv_compareNames("UTF-7",cp)==0){
        return TRUE;
    }
    return FALSE;
}